

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEra2.c
# Opt level: O2

void Gia_ManAreDeriveCexSatStop(Gia_ManAre_t *p)

{
  if ((sat_solver *)p->pSat == (sat_solver *)0x0) {
    __assert_fail("p->pSat != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEra2.c"
                  ,0x725,"void Gia_ManAreDeriveCexSatStop(Gia_ManAre_t *)");
  }
  if (p->pTarget != (Gia_StaAre_t *)0x0) {
    sat_solver_delete((sat_solver *)p->pSat);
    Vec_IntFree(p->vSatNumCis);
    Vec_IntFree(p->vSatNumCos);
    Vec_IntFree(p->vAssumps);
    Vec_IntFree(p->vCofVars);
    p->pTarget = (Gia_StaAre_t *)0x0;
    p->pSat = (void *)0x0;
    return;
  }
  __assert_fail("p->pTarget != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEra2.c"
                ,0x726,"void Gia_ManAreDeriveCexSatStop(Gia_ManAre_t *)");
}

Assistant:

void Gia_ManAreDeriveCexSatStop( Gia_ManAre_t * p )
{
    assert( p->pSat != NULL );
    assert( p->pTarget != NULL );
    sat_solver_delete( (sat_solver *)p->pSat );
    Vec_IntFree( p->vSatNumCis );
    Vec_IntFree( p->vSatNumCos );
    Vec_IntFree( p->vAssumps );
    Vec_IntFree( p->vCofVars );
    p->pTarget = NULL;
    p->pSat = NULL;
}